

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fld.c
# Opt level: O3

int fld_eq(limb_t *a,limb_t *b)

{
  bool bVar1;
  int i;
  long lVar2;
  uint uVar3;
  fld_t tmp;
  ulong local_38 [6];
  
  lVar2 = 0;
  do {
    local_38[lVar2] = a[lVar2] - b[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  fld_reduce((limb_t *)local_38,(limb_t *)local_38);
  local_38[4] = local_38[1] | local_38[3] | local_38[0] | local_38[2] | local_38[4];
  uVar3 = 0x20;
  do {
    local_38[4] = (long)local_38[4] >> (sbyte)uVar3 | local_38[4];
    bVar1 = 1 < uVar3;
    uVar3 = uVar3 >> 1;
  } while (bVar1);
  return ~(uint)local_38[4] & 1;
}

Assistant:

int
fld_eq(const fld_t a, const fld_t b)
{
	fld_t tmp;
	limb_t res;
	int i;

	/* tmp <- a - b */
	fld_sub(tmp, a, b);
	fld_reduce(tmp, tmp);

	/* and check tmp for zero */
	res = tmp[0];
	for (i = 1; i < FLD_LIMB_NUM; i++)
		res |= tmp[i];
	for (i = 4*sizeof(limb_t); i > 0; i >>= 1)
                res |= res >> i;

	/* now (res & 1) is zero iff tmp is zero */
	res = ~res & 1;

	return res;
}